

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

bool __thiscall
chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,myEmployee>
          (ChArchiveExplorer *this,myEmployee *val,myEmployeeBoss *root,string *property_name)

{
  ChValue *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  myEmployee *pmVar3;
  ChNameValue<myEmployeeBoss> local_30;
  
  PrepareSearch(this,property_name);
  local_30._name = "";
  local_30._flags = '\0';
  local_30._value = root;
  ChArchiveOut::operator<<(&this->super_ChArchiveOut,&local_30);
  if (this->found == true) {
    iVar2 = (*(*(this->results).
                super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
                super__Vector_impl_data._M_start)->_vptr_ChValue[6])();
    bVar1 = std::type_info::operator==
                      ((type_info *)CONCAT44(extraout_var,iVar2),(type_info *)&myEmployee::typeinfo)
    ;
    this_00 = *(this->results).
               super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (bVar1) {
      iVar2 = (*this_00->_vptr_ChValue[0xc])();
      pmVar3 = (myEmployee *)CONCAT44(extraout_var_00,iVar2);
    }
    else {
      pmVar3 = ChValue::PointerUpCast<myEmployee>(this_00);
      if (pmVar3 == (myEmployee *)0x0) goto LAB_0012484b;
    }
    myEmployee::operator=(val,pmVar3);
    bVar1 = true;
  }
  else {
LAB_0012484b:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FetchValue(P& val, const T& root, const std::string& property_name) {

          this->PrepareSearch(property_name);
          
          this->operator<<( CHNVP(root,"") ); // SCAN! 

          if (found) {
              if (*this->results[0]->GetTypeid() == typeid(P)) { 
                  val = *(static_cast<P*> (this->results[0]->GetRawPtr()));
                  return true;
              }
              else if (P* valptr = this->results[0]->PointerUpCast<P>()) {
                  val = *valptr;
                  return true;
              } else
                  return false;
          }
          else
              return false;
      }